

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmArray(ExpressionContext *ctx,VmModule *module,ExprArray *node)

{
  uint uniqueId;
  TypeBase *type;
  TypeBase *type_00;
  Allocator *allocator;
  SynBase *pSVar1;
  ExprBase *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  VmInstruction *argument;
  VmConstant *address;
  VmValue *pVVar4;
  VmConstant *arrayLength;
  VmConstant *elementSize;
  VmConstant *index;
  TypeRef *structType;
  VmValue *address_00;
  VmInstruction *this;
  IntrusiveList<ExprBase> *pIVar5;
  VmType type_01;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  type = (node->super_ExprBase).type;
  if ((type != (TypeBase *)0x0) && (type->typeID == 0x13)) {
    type_00 = (TypeBase *)type[1]._vptr_TypeBase;
    if (((type_00 == ctx->typeBool) || (type_00 == ctx->typeChar)) || (type_00 == ctx->typeShort)) {
      pVVar4 = (VmValue *)0x1;
      address = anon_unknown.dwarf_f89de::CreateAlloca
                          (ctx,module,(node->super_ExprBase).source,type,"arr_lit",true);
      iVar3 = 0;
      pIVar5 = &node->values;
      while (pEVar2 = pIVar5->head, pEVar2 != (ExprBase *)0x0) {
        pVVar4 = CompileVm(ctx,module,pEVar2);
        arrayLength = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                        type[1].typeID);
        elementSize = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                        (int)type_00->size);
        index = CreateConstantInt(module->allocator,(node->super_ExprBase).source,iVar3);
        pSVar1 = (node->super_ExprBase).source;
        structType = ExpressionContext::GetReferenceType(ctx,type_00);
        address_00 = anon_unknown.dwarf_f89de::CreateIndex
                               (module,pSVar1,&arrayLength->super_VmValue,
                                &elementSize->super_VmValue,&address->super_VmValue,
                                &index->super_VmValue,&structType->super_TypeBase);
        anon_unknown.dwarf_f89de::CreateStore
                  (ctx,module,(node->super_ExprBase).source,type_00,address_00,pVVar4,0);
        iVar3 = iVar3 + 1;
        pIVar5 = (IntrusiveList<ExprBase> *)&pEVar2->next;
      }
      this = (VmInstruction *)
             anon_unknown.dwarf_f89de::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,type,&address->super_VmValue,
                        (uint)pVVar4);
    }
    else {
      iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x138);
      this = (VmInstruction *)CONCAT44(extraout_var,iVar3);
      allocator = module->allocator;
      type_01 = GetVmType(ctx,(node->super_ExprBase).type);
      pSVar1 = (node->super_ExprBase).source;
      uniqueId = module->currentFunction->nextInstructionId;
      module->currentFunction->nextInstructionId = uniqueId + 1;
      pVVar4 = (VmValue *)CONCAT44(uVar6,uniqueId);
      VmInstruction::VmInstruction(this,allocator,type_01,pSVar1,VM_INST_ARRAY,uniqueId);
      pIVar5 = &node->values;
      while (pEVar2 = pIVar5->head, pEVar2 != (ExprBase *)0x0) {
        argument = (VmInstruction *)CompileVm(ctx,module,pEVar2);
        if (type_00 == ctx->typeFloat) {
          argument = anon_unknown.dwarf_f89de::CreateInstruction
                               ((anon_unknown_dwarf_f89de *)module,
                                (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                                (VmType)(ZEXT816(0x11) << 0x40),(VmInstructionType)argument,pVVar4);
        }
        VmInstruction::AddArgument(this,&argument->super_VmValue);
        pIVar5 = (IntrusiveList<ExprBase> *)&pEVar2->next;
      }
      VmBlock::AddInstruction(module->currentBlock,this);
    }
    anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,&this->super_VmValue);
    return &this->super_VmValue;
  }
  __assert_fail("isType<TypeArray>(node->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xa23,"VmValue *CompileVmArray(ExpressionContext &, VmModule *, ExprArray *)");
}

Assistant:

VmValue* CompileVmArray(ExpressionContext &ctx, VmModule *module, ExprArray *node)
{
	assert(isType<TypeArray>(node->type));

	TypeArray *typeArray = getType<TypeArray>(node->type);

	TypeBase *elementType = typeArray->subType;

	if(elementType == ctx.typeBool || elementType == ctx.typeChar || elementType == ctx.typeShort)
	{
		VmValue *storage = CreateAlloca(ctx, module, node->source, typeArray, "arr_lit", true);

		unsigned i = 0;

		for(ExprBase *value = node->values.head; value; value = value->next)
		{
			VmValue *element = CompileVm(ctx, module, value);

			VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(typeArray->length));
			VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(elementType->size));
			VmValue *index = CreateConstantInt(module->allocator, node->source, i);

			VmValue *address = CreateIndex(module, node->source, arrayLength, elementSize, storage, index, ctx.GetReferenceType(elementType));

			CreateStore(ctx, module, node->source, elementType, address, element, 0);

			i++;
		}

		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, typeArray, storage, 0));
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_ARRAY, module->currentFunction->nextInstructionId++);

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		VmValue *element = CompileVm(ctx, module, value);

		if(elementType == ctx.typeFloat)
			element = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, element);

		inst->AddArgument(element);
	}

	module->currentBlock->AddInstruction(inst);

	return CheckType(ctx, node, inst);
}